

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpAccInst *i)

{
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> local_a0;
  uint local_94;
  _Head_base<0UL,_arm::Arith4Inst_*,_false> local_90;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_88;
  Reg local_80;
  Reg local_7c;
  Reg local_78;
  Reg local_74;
  VarId local_70;
  VarId local_60;
  VarId local_50;
  VarId local_40;
  
  if (i->op == MulShAdd) {
    local_88 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    local_94 = 0xf;
    local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_60.id = (i->super_Inst).dest.id;
    local_74 = translate_var_reg(this,&local_60);
    local_78 = translate_value_to_reg(this,&i->lhs);
    local_7c = translate_value_to_reg(this,&i->rhs);
    local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_70.id = (i->acc).id;
    local_80 = translate_var_reg(this,&local_70);
    std::
    make_unique<arm::Arith4Inst,arm::OpCode,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              ((OpCode *)&local_90,&local_94,&local_74,&local_78,&local_7c);
    local_a0._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)local_90._M_head_impl;
    local_90._M_head_impl = (Arith4Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_88,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  }
  else {
    if (i->op != MulAdd) {
      return;
    }
    local_88 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    local_94 = 0xe;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_40.id = (i->super_Inst).dest.id;
    local_74 = translate_var_reg(this,&local_40);
    local_78 = translate_value_to_reg(this,&i->lhs);
    local_7c = translate_value_to_reg(this,&i->rhs);
    local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_50.id = (i->acc).id;
    local_80 = translate_var_reg(this,&local_50);
    std::
    make_unique<arm::Arith4Inst,arm::OpCode,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              ((OpCode *)&local_90,&local_94,&local_74,&local_78,&local_7c);
    local_a0._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)local_90._M_head_impl;
    local_90._M_head_impl = (Arith4Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_88,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  }
  if (local_a0._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))();
  }
  local_a0._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
       (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
       (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)0x0;
  std::unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> *)&local_90);
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpAccInst& i) {
  switch (i.op) {
    case mir::inst::OpAcc::MulAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::Mla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
    case mir::inst::OpAcc::MulShAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::SMMla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
  }
}